

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O0

string * __thiscall
SslTcpSocketImpl::GetSelAlpnProtocol_abi_cxx11_
          (string *__return_storage_ptr__,SslTcpSocketImpl *this)

{
  bool bVar1;
  pointer this_00;
  SslTcpSocketImpl *this_local;
  
  bVar1 = std::operator!=(&this->m_pSslCon,(nullptr_t)0x0);
  if (bVar1) {
    this_00 = std::
              unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
              ::operator->(&this->m_pSslCon);
    OpenSSLWrapper::SslConnection::GetSelAlpnProtocol_abi_cxx11_(__return_storage_ptr__,this_00);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

const string SslTcpSocketImpl::GetSelAlpnProtocol() const
{
    if (m_pSslCon != nullptr)
        return m_pSslCon->GetSelAlpnProtocol();
    return string();
}